

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

void __thiscall cornerstone::raft_server::invite_srv_to_join_cluster(raft_server *this)

{
  int iVar1;
  undefined4 extraout_var;
  int local_74;
  shared_ptr<cornerstone::log_entry> local_70;
  _Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false> local_60;
  _Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false> local_50;
  ptr<req_msg> req;
  int32 local_34;
  
  local_70.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->term_;
  local_74 = 0xc;
  local_34 = ((((this->srv_to_join_).
                super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_).
              super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
  local_60._M_head_impl = (_func_void_buffer_ptr *)0x0;
  iVar1 = (*((this->log_store_).
             super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_log_store[2])();
  local_50._M_head_impl = (_func_void_buffer_ptr *)(CONCAT44(extraout_var,iVar1) - 1);
  std::
  make_shared<cornerstone::req_msg,unsigned_long,cornerstone::msg_type,int&,int,long,unsigned_long,unsigned_long&>
            ((unsigned_long *)&req,(msg_type *)&local_70,&local_74,&this->id_,(long *)&local_34,
             (unsigned_long *)&stack0xffffffffffffffa0,(unsigned_long *)&stack0xffffffffffffffb0);
  local_50._M_head_impl =
       (_func_void_buffer_ptr *)
       ((this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->term_;
  cluster_config::serialize((cluster_config *)&stack0xffffffffffffffa0);
  local_74 = 2;
  std::
  make_shared<cornerstone::log_entry,unsigned_long,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,cornerstone::log_val_type>
            ((unsigned_long *)&local_70,
             (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
             &stack0xffffffffffffffb0,(log_val_type *)&stack0xffffffffffffffa0);
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,std::allocator<std::shared_ptr<cornerstone::log_entry>>>
  ::emplace_back<std::shared_ptr<cornerstone::log_entry>>
            ((vector<std::shared_ptr<cornerstone::log_entry>,std::allocator<std::shared_ptr<cornerstone::log_entry>>>
              *)&(req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 log_entries_,&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
             &stack0xffffffffffffffa0);
  peer::send_req((this->srv_to_join_).
                 super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&req,
                 &this->ex_resp_handler_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void raft_server::invite_srv_to_join_cluster()
{
    ptr<req_msg> req(cs_new<req_msg>(
        state_->get_term(),
        msg_type::join_cluster_request,
        id_,
        srv_to_join_->get_id(),
        0L,
        log_store_->next_slot() - 1,
        quick_commit_idx_));
    req->log_entries().push_back(cs_new<log_entry>(state_->get_term(), config_->serialize(), log_val_type::conf));
    srv_to_join_->send_req(req, ex_resp_handler_);
}